

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fsm.cc
# Opt level: O2

void __thiscall
kratos::FSM::generate_output
          (FSM *this,Enum *enum_def,EnumVar *current_state,
          unordered_map<kratos::FSMState_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<kratos::FSMState_*>,_std::equal_to<kratos::FSMState_*>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *state_name_mapping)

{
  undefined1 *puVar1;
  pointer *block_name;
  pointer ppVVar2;
  mapped_type pVVar3;
  mapped_type var;
  Generator *this_00;
  pointer ppFVar4;
  undefined1 this_01 [8];
  pointer ppVVar5;
  key_type pFVar6;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var7;
  mapped_type *ppVVar8;
  iterator iVar9;
  mapped_type *__args;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  in_R9;
  pointer ppVVar10;
  undefined1 __k [8];
  basic_string_view<char> bVar11;
  string_view format_str;
  format_args args;
  size_type *psStack_170;
  string state_name;
  shared_ptr<kratos::CombinationalStmtBlock> output_comb;
  vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> states;
  shared_ptr<kratos::AssignStmt> stmt;
  undefined1 local_e8 [8];
  shared_ptr<kratos::SwitchStmt> output_case_comb;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_d0;
  undefined1 auStack_c8 [8];
  vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> vars;
  undefined1 auStack_a8 [8];
  shared_ptr<kratos::EnumConst> state_enum;
  vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_> stmts;
  element_type *peStack_78;
  Var *iter;
  __node_base local_68;
  pointer pcStack_60;
  key_type local_40;
  FSMState *state;
  
  vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)enum_def;
  state = (FSMState *)this;
  Generator::combinational((Generator *)((long)&state_name.field_2 + 8));
  std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
            ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff88,
             (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
             &(current_state->super_Var).super_enable_shared_from_this<kratos::Var>);
  std::make_shared<kratos::SwitchStmt,std::shared_ptr<kratos::Var>>
            ((shared_ptr<kratos::Var> *)local_e8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&iter);
  get_all_child_states
            ((vector<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)
             &output_comb.
              super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,(FSM *)state,false);
  puVar1 = (undefined1 *)
           ((long)&vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage[7][-1].extended_._M_h._M_single_bucket
           + 7);
  if ((undefined1 *)
      ((ulong)vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage[7] ^ (ulong)puVar1) <= puVar1) {
    peStack_78 = (element_type *)0x0;
    std::vector<kratos::FSMState*,std::allocator<kratos::FSMState*>>::
    emplace_back<decltype(nullptr)>
              ((vector<kratos::FSMState*,std::allocator<kratos::FSMState*>> *)
               &output_comb.
                super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,&stack0xffffffffffffff88);
  }
  for (_Var7._M_pi = output_comb.
                     super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi;
      _Var7._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>._M_impl.
      super__Vector_impl_data._M_start;
      _Var7._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)&(_Var7._M_pi)->_M_use_count) {
    local_40 = (key_type)(_Var7._M_pi)->_vptr__Sp_counted_base;
    psStack_170 = &state_name._M_string_length;
    state_name._M_dataplus._M_p = (pointer)0x0;
    auStack_a8 = (undefined1  [8])0x0;
    state_enum.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)0x0;
    state_name._M_string_length._0_1_ = 0;
    if (local_40 == (key_type)0x0) {
      std::__cxx11::string::assign((char *)&psStack_170);
      peStack_78 = (element_type *)0x0;
      iter = (Var *)0x0;
      std::__shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2> *)auStack_a8,
                 (__shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2> *)
                 &stack0xffffffffffffff88);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&iter);
      local_40 = (key_type)(state->next_state_fn_ln_)._M_h._M_single_bucket;
    }
    else {
      std::__detail::
      _Map_base<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
      ::at((_Map_base<kratos::FSMState_*,_std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<kratos::FSMState_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::FSMState_*>,_std::hash<kratos::FSMState_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
            *)state_name_mapping,&local_40);
      std::__cxx11::string::_M_assign((string *)&psStack_170);
      Enum::get_enum((Enum *)&stack0xffffffffffffff88,
                     (string *)
                     vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
      std::__shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>::operator=
                ((__shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2> *)auStack_a8,
                 (__shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2> *)
                 &stack0xffffffffffffff88);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&iter);
    }
    pFVar6 = local_40;
    state_enum.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
    reserve((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             *)&state_enum.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount,
            (local_40->output_values_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    auStack_c8 = (undefined1  [8])0x0;
    vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::reserve
              ((vector<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)auStack_c8,
               (pFVar6->output_values_)._M_t._M_impl.super__Rb_tree_header._M_node_count);
    ppVVar2 = (pFVar6->output_ordering_).
              super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppVVar10 = (pFVar6->output_ordering_).
                    super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
                    super__Vector_impl_data._M_start;
        ppVVar5 = vars.super__Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>._M_impl.
                  super__Vector_impl_data._M_start, __k = auStack_c8, ppVVar10 != ppVVar2;
        ppVVar10 = ppVVar10 + 1) {
      peStack_78 = (element_type *)*ppVVar10;
      std::vector<kratos::Var*,std::allocator<kratos::Var*>>::emplace_back<kratos::Var*&>
                ((vector<kratos::Var*,std::allocator<kratos::Var*>> *)auStack_c8,
                 (Var **)&stack0xffffffffffffff88);
    }
    for (; this_01 = local_e8, __k != (undefined1  [8])ppVVar5;
        __k = (undefined1  [8])((long)__k + 8)) {
      ppVVar8 = std::
                map<kratos::Var_*,_kratos::Var_*,_std::less<kratos::Var_*>,_std::allocator<std::pair<kratos::Var_*const,_kratos::Var_*>_>_>
                ::at(&pFVar6->output_values_,(key_type *)__k);
      pVVar3 = *ppVVar8;
      var = *(mapped_type *)__k;
      if (pVVar3 != var && pVVar3 != (mapped_type)0x0) {
        std::__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::Var,void>
                  ((__shared_ptr<kratos::Var,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff88,
                   (__weak_ptr<kratos::Var,_(__gnu_cxx::_Lock_policy)2> *)
                   &pVVar3->super_enable_shared_from_this<kratos::Var>);
        Var::assign((Var *)&states.
                            super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,
                    (shared_ptr<kratos::Var> *)var);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&iter);
        if (*(char *)((state->name_).field_2._M_allocated_capacity + 0xbc) == '\x01') {
          std::
          _Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::_Hashtable((_Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                        *)&stack0xffffffffffffff88,&(local_40->output_fn_ln_)._M_h);
          iVar9 = std::
                  _Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                  ::find((_Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                          *)&stack0xffffffffffffff88,(key_type *)__k);
          ppFVar4 = states.
                    super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
          if (iVar9.
              super__Node_iterator_base<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_false>
              ._M_cur != (__node_type *)0x0) {
            __args = std::__detail::
                     _Map_base<kratos::Var_*,_std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                     ::at((_Map_base<kratos::Var_*,_std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&stack0xffffffffffffff88,(key_type *)__k);
            std::
            vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
            ::emplace_back<std::pair<std::__cxx11::string,unsigned_int>&>
                      ((vector<std::pair<std::__cxx11::string,unsigned_int>,std::allocator<std::pair<std::__cxx11::string,unsigned_int>>>
                        *)(ppFVar4 + 1),__args);
          }
          std::
          _Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
          ::~_Hashtable((_Hashtable<kratos::Var_*,_std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>,_std::allocator<std::pair<kratos::Var_*const,_std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_int>_>_>,_std::__detail::_Select1st,_std::equal_to<kratos::Var_*>,_std::hash<kratos::Var_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
                         *)&stack0xffffffffffffff88);
        }
        std::vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>::
        emplace_back<std::shared_ptr<kratos::AssignStmt>&>
                  ((vector<std::shared_ptr<kratos::Stmt>,std::allocator<std::shared_ptr<kratos::Stmt>>>
                    *)&state_enum.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount,
                   (shared_ptr<kratos::AssignStmt> *)
                   &states.
                    super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&stmt);
      }
    }
    if (state_enum.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
        _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::__shared_ptr<kratos::Const,(__gnu_cxx::_Lock_policy)2>::
      __shared_ptr<kratos::EnumConst,void>
                ((__shared_ptr<kratos::Const,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff88,
                 (__shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2> *)auStack_a8);
      SwitchStmt::add_switch_case
                ((SwitchStmt *)this_01,(shared_ptr<kratos::Const> *)&stack0xffffffffffffff88,
                 (vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
                  *)&state_enum.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&iter);
      this_00 = (Generator *)(state->name_).field_2._M_allocated_capacity;
      peStack_78 = (element_type *)
                   (state->super_enable_shared_from_this<kratos::FSMState>)._M_weak_this.
                   super___weak_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      iter = (Var *)(state->super_enable_shared_from_this<kratos::FSMState>)._M_weak_this.
                    super___weak_ptr<kratos::FSMState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
      ;
      local_68._M_nxt = (_Hash_node_base *)psStack_170;
      pcStack_60 = state_name._M_dataplus._M_p;
      bVar11 = fmt::v7::to_string_view<char,_0>("{0}_{1}_Output");
      format_str.data_ = (char *)bVar11.size_;
      format_str.size_ = 0xdd;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .field_1.args_ = in_R9.args_;
      args.
      super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
      .desc_ = (unsigned_long_long)&stack0xffffffffffffff88;
      fmt::v7::detail::vformat_abi_cxx11_
                ((string *)
                 &states.super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(detail *)bVar11.data_,
                 format_str,args);
      Stmt::as<kratos::ScopedStmtBlock>
                ((Stmt *)&output_case_comb.
                          super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount);
      peStack_78 = (element_type *)
                   output_case_comb.
                   super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi;
      iter = (Var *)_Stack_d0._M_pi;
      output_case_comb.super___shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      _Stack_d0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      block_name = &states.
                    super__Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>.
                    _M_impl.super__Vector_impl_data._M_end_of_storage;
      Generator::add_named_block
                (this_00,(string *)block_name,
                 (shared_ptr<kratos::StmtBlock> *)&stack0xffffffffffffff88);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&iter);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_d0);
      std::__cxx11::string::~string((string *)block_name);
    }
    std::_Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_>::~_Vector_base
              ((_Vector_base<kratos::Var_*,_std::allocator<kratos::Var_*>_> *)auStack_c8);
    std::vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>::
    ~vector((vector<std::shared_ptr<kratos::Stmt>,_std::allocator<std::shared_ptr<kratos::Stmt>_>_>
             *)&state_enum.super___shared_ptr<kratos::EnumConst,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    std::__cxx11::string::~string((string *)&psStack_170);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&state_enum);
  }
  std::__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<kratos::SwitchStmt,void>
            ((__shared_ptr<kratos::Stmt,(__gnu_cxx::_Lock_policy)2> *)&stack0xffffffffffffff88,
             (__shared_ptr<kratos::SwitchStmt,_(__gnu_cxx::_Lock_policy)2> *)local_e8);
  StmtBlock::add_stmt((StmtBlock *)state_name.field_2._8_8_,
                      (shared_ptr<kratos::Stmt> *)&stack0xffffffffffffff88);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&iter);
  std::_Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_>::~_Vector_base
            ((_Vector_base<kratos::FSMState_*,_std::allocator<kratos::FSMState_*>_> *)
             &output_comb.
              super___shared_ptr<kratos::CombinationalStmtBlock,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&output_case_comb);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&output_comb);
  return;
}

Assistant:

void FSM::generate_output(Enum& enum_def, EnumVar& current_state,
                          const std::unordered_map<FSMState*, std::string>& state_name_mapping) {
    auto output_comb = generator_->combinational();
    auto output_case_comb = std::make_shared<SwitchStmt>(current_state.shared_from_this());
    auto states = get_all_child_states(false);

    // need to deal with fully specified case where default is the same as start state
    // also default case
    if (!is_2_power(enum_def.values.size())) {
        states.emplace_back(nullptr);
    }

    for (auto* state : states) {
        std::shared_ptr<EnumConst> state_enum;
        std::string state_name;
        if (state) {
            state_name = state_name_mapping.at(state);
            state_enum = enum_def.get_enum(state_name);
        } else {
            state_name = "default";
            state_enum = nullptr;
            // use default state outputs
            state = start_state_.get();
        }

        std::vector<std::shared_ptr<Stmt>> stmts;
        auto const& output_values = state->output_values();
        auto const& output_ordering = state->output_ordering();
        stmts.reserve(output_values.size());
        // sort the names
        std::vector<Var*> vars;
        vars.reserve(output_values.size());
        for (auto* iter : output_ordering) vars.emplace_back(iter);
        for (auto const& output_var : vars) {
            auto* value = output_values.at(output_var);
            if (value && value != output_var) {
                // value can be a nullptr
                // users may use the same variable to indicate not changed
                auto stmt = output_var->assign(value->shared_from_this());
                if (generator_->debug) {
                    auto debug_info = state->output_fn_ln();
                    if (debug_info.find(output_var) != debug_info.end())
                        stmt->fn_name_ln.emplace_back(debug_info.at(output_var));
                }
                stmts.emplace_back(stmt);
            }
        }
        // add it to the case
        if (!stmts.empty()) {
            auto& case_stmt = output_case_comb->add_switch_case(state_enum, stmts);
            generator_->add_named_block(::format("{0}_{1}_Output", fsm_name_, state_name),
                                        case_stmt.as<ScopedStmtBlock>());
        }
    }

    // add it to the output_comb
    output_comb->add_stmt(output_case_comb);
}